

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_401(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x3f2].name == (char *)0x0) && (env->spr[0x3f2] == 0)) &&
      (env->spr_cb[0x3f2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3f2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3f2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3f2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3f2].name = "DBCR";
    env->spr_cb[0x3f2].uea_read = spr_noaccess;
    env->spr_cb[0x3f2].uea_write = spr_noaccess;
    env->spr_cb[0x3f2].oea_read = spr_read_generic;
    env->spr_cb[0x3f2].oea_write = spr_write_40x_dbcr0;
    env->spr_cb[0x3f2].hea_read = spr_read_generic;
    env->spr_cb[0x3f2].hea_write = spr_write_40x_dbcr0;
    env->spr_cb[0x3f2].default_value = 0;
    env->spr[0x3f2] = 0;
    if (((env->spr_cb[0x3f0].name == (char *)0x0) && (env->spr[0x3f0] == 0)) &&
       ((env->spr_cb[0x3f0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f0].name = "DBSR";
      env->spr_cb[0x3f0].uea_read = spr_noaccess;
      env->spr_cb[0x3f0].uea_write = spr_noaccess;
      env->spr_cb[0x3f0].oea_read = spr_read_generic;
      env->spr_cb[0x3f0].oea_write = spr_write_clear;
      env->spr_cb[0x3f0].hea_read = spr_read_generic;
      env->spr_cb[0x3f0].hea_write = spr_write_clear;
      env->spr_cb[0x3f0].default_value = 0x300;
      env->spr[0x3f0] = 0x300;
      if (((env->spr_cb[0x3f6].name == (char *)0x0) && (env->spr[0x3f6] == 0)) &&
         (((env->spr_cb[0x3f6].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3f6].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3f6].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x3f6].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x3f6].name = "DAC";
        env->spr_cb[0x3f6].uea_read = spr_noaccess;
        env->spr_cb[0x3f6].uea_write = spr_noaccess;
        env->spr_cb[0x3f6].oea_read = spr_read_generic;
        env->spr_cb[0x3f6].oea_write = spr_write_generic;
        env->spr_cb[0x3f6].hea_read = spr_read_generic;
        env->spr_cb[0x3f6].hea_write = spr_write_generic;
        env->spr_cb[0x3f6].default_value = 0;
        env->spr[0x3f6] = 0;
        if (((((env->spr_cb[0x3f4].name == (char *)0x0) && (env->spr[0x3f4] == 0)) &&
             (env->spr_cb[0x3f4].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x3f4].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3f4].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x3f4].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x3f4].name = "IAC";
          env->spr_cb[0x3f4].uea_read = spr_noaccess;
          env->spr_cb[0x3f4].uea_write = spr_noaccess;
          env->spr_cb[0x3f4].oea_read = spr_read_generic;
          env->spr_cb[0x3f4].oea_write = spr_write_generic;
          env->spr_cb[0x3f4].hea_read = spr_read_generic;
          env->spr_cb[0x3f4].hea_write = spr_write_generic;
          env->spr_cb[0x3f4].default_value = 0;
          env->spr[0x3f4] = 0;
          if (((env->spr_cb[0x3bb].name == (char *)0x0) && (env->spr[0x3bb] == 0)) &&
             ((env->spr_cb[0x3bb].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3bb].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3bb].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3bb].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3bb].name = "SLER";
            env->spr_cb[0x3bb].uea_read = spr_noaccess;
            env->spr_cb[0x3bb].uea_write = spr_noaccess;
            env->spr_cb[0x3bb].oea_read = spr_read_generic;
            env->spr_cb[0x3bb].oea_write = spr_write_40x_sler;
            env->spr_cb[0x3bb].hea_read = spr_read_generic;
            env->spr_cb[0x3bb].hea_write = spr_write_40x_sler;
            env->spr_cb[0x3bb].default_value = 0;
            env->spr[0x3bb] = 0;
            if ((((env->spr_cb[0x3b9].name == (char *)0x0) && (env->spr[0x3b9] == 0)) &&
                ((env->spr_cb[0x3b9].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3b9].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3b9].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x3b9].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x3b9].name = "SGR";
              env->spr_cb[0x3b9].uea_read = spr_noaccess;
              env->spr_cb[0x3b9].uea_write = spr_noaccess;
              env->spr_cb[0x3b9].oea_read = spr_read_generic;
              env->spr_cb[0x3b9].oea_write = spr_write_generic;
              env->spr_cb[0x3b9].hea_read = spr_read_generic;
              env->spr_cb[0x3b9].hea_write = spr_write_generic;
              env->spr_cb[0x3b9].default_value = 0xffffffff;
              env->spr[0x3b9] = 0xffffffff;
              if ((((env->spr_cb[0x3ba].name == (char *)0x0) && (env->spr[0x3ba] == 0)) &&
                  (env->spr_cb[0x3ba].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                 (((env->spr_cb[0x3ba].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3ba].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  (env->spr_cb[0x3ba].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                env->spr_cb[0x3ba].name = "DCWR";
                env->spr_cb[0x3ba].uea_read = spr_noaccess;
                env->spr_cb[0x3ba].uea_write = spr_noaccess;
                env->spr_cb[0x3ba].oea_read = spr_read_generic;
                env->spr_cb[0x3ba].oea_write = spr_write_generic;
                env->spr_cb[0x3ba].hea_read = spr_read_generic;
                env->spr_cb[0x3ba].hea_write = spr_write_generic;
                env->spr_cb[0x3ba].default_value = 0;
                env->spr[0x3ba] = 0;
                return;
              }
              uVar2 = 0x3ba;
              uVar1 = 0x3ba;
            }
            else {
              uVar2 = 0x3b9;
              uVar1 = 0x3b9;
            }
          }
          else {
            uVar2 = 0x3bb;
            uVar1 = 0x3bb;
          }
        }
        else {
          uVar2 = 0x3f4;
          uVar1 = 0x3f4;
        }
      }
      else {
        uVar2 = 0x3f6;
        uVar1 = 0x3f6;
      }
    }
    else {
      uVar2 = 0x3f0;
      uVar1 = 0x3f0;
    }
  }
  else {
    uVar2 = 0x3f2;
    uVar1 = 0x3f2;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_401(CPUPPCState *env)
{
    /* Debug interface */
    /* XXX : not implemented */
    spr_register(env, SPR_40x_DBCR0, "DBCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_40x_dbcr0,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_40x_DBSR, "DBSR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_clear,
                 /* Last reset was system reset */
                 0x00000300);
    /* XXX : not implemented */
    spr_register(env, SPR_40x_DAC1, "DAC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_40x_IAC1, "IAC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Storage control */
    /* XXX: TODO: not implemented */
    spr_register(env, SPR_405_SLER, "SLER",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_40x_sler,
                 0x00000000);
    /* not emulated, as QEMU never does speculative access */
    spr_register(env, SPR_40x_SGR, "SGR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0xFFFFFFFF);
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_40x_DCWR, "DCWR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}